

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  st_ptls_on_extension_t *psVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  ptls_iovec_t pVar14;
  byte local_48 [8];
  uint8_t *local_40;
  uint8_t *local_38;
  
  iVar7 = 0x32;
  if (3 < (long)end - (long)src) {
    uVar3 = *(uint *)src;
    *lifetime = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    if (3 < ((long)end - (long)src) + -4) {
      uVar3 = *(uint *)(src + 4);
      *age_add = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if (src + 8 != end) {
        puVar13 = src + 9;
        uVar10 = (ulong)src[8];
        if (uVar10 <= (ulong)((long)end - (long)puVar13)) {
          nonce->base = puVar13;
          nonce->len = uVar10;
          if (1 < (ulong)((long)end - (long)(puVar13 + uVar10))) {
            puVar13 = src + uVar10 + 0xb;
            uVar8 = (ulong)src[uVar10 + 9] * 0x100;
            uVar11 = (ulong)src[uVar10 + 10];
            if ((uVar8 + uVar11) - 1 < (ulong)((long)end - (long)puVar13)) {
              ticket->base = puVar13;
              ticket->len = (long)(src + uVar8 + uVar11 + uVar10 + 0xb) - (long)puVar13;
              *max_early_data_size = 0;
              local_48[0] = 0x21;
              local_48[1] = 0x24;
              local_48[2] = 1;
              local_48[3] = 0;
              local_48[4] = 0;
              local_48[5] = 0x3a;
              local_48[6] = 8;
              local_48[7] = 0;
              if (1 < (ulong)((long)end - (long)(src + uVar8 + uVar11 + uVar10 + 0xb))) {
                lVar9 = (uVar8 | uVar11) + uVar10;
                uVar10 = (ulong)(ushort)(*(ushort *)(src + uVar8 + uVar11 + uVar10 + 0xb) << 8 |
                                        *(ushort *)(src + uVar8 + uVar11 + uVar10 + 0xb) >> 8);
                puVar13 = src + lVar9 + 0xd;
                if (uVar10 <= (ulong)((long)end - (long)puVar13)) {
                  puVar12 = puVar13;
                  if (uVar10 != 0) {
                    puVar12 = src + uVar10 + lVar9 + 0xd;
                    local_40 = puVar12;
                    do {
                      if ((long)puVar12 - (long)puVar13 < 2) {
                        return 0x32;
                      }
                      uVar1 = *puVar13;
                      bVar2 = puVar13[1];
                      uVar5 = CONCAT11(uVar1,bVar2);
                      if (uVar5 < 0x40) {
                        if ((local_48[uVar5 >> 3] >> (uVar5 & 7) & 1) != 0) {
                          return 0x2f;
                        }
                        local_48[bVar2 >> 3] = local_48[bVar2 >> 3] | '\x01' << (bVar2 & 7);
                      }
                      if ((ulong)((long)puVar12 - (long)(puVar13 + 2)) < 2) {
                        return 0x32;
                      }
                      uVar6 = *(ushort *)(puVar13 + 2) << 8 | *(ushort *)(puVar13 + 2) >> 8;
                      if ((ulong)((long)puVar12 - (long)(puVar13 + 4)) < (ulong)uVar6) {
                        return 0x32;
                      }
                      psVar4 = tls->ctx->on_extension;
                      local_38 = puVar13;
                      if ((psVar4 != (st_ptls_on_extension_t *)0x0) &&
                         (pVar14.len._0_2_ = uVar6, pVar14.base = puVar13 + 4, pVar14.len._2_6_ = 0,
                         iVar7 = (*psVar4->cb)(psVar4,tls,'\x04',CONCAT11(uVar1,bVar2),pVar14),
                         puVar12 = local_40, iVar7 != 0)) {
                        return 1;
                      }
                      if (uVar5 == 0x2a) {
                        if (uVar6 < 4) {
                          return 0x32;
                        }
                        uVar3 = *(uint *)(local_38 + 4);
                        *max_early_data_size =
                             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                             uVar3 << 0x18;
                        if (uVar6 != 4) {
                          return 0x32;
                        }
                        puVar13 = local_38 + 8;
                      }
                      else {
                        puVar13 = local_38 + (ulong)uVar6 + 4;
                      }
                    } while (puVar13 != puVar12);
                  }
                  iVar7 = 0x32;
                  if (puVar12 == end) {
                    iVar7 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}